

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyParseRowGroup(TidyDocImpl *doc,Node *rowgroup,GetTokenMode mode)

{
  TidyTagId TVar1;
  Lexer *pLVar2;
  Bool BVar3;
  Node *node;
  Node *pNVar4;
  Dict *pDVar5;
  Node **ppNVar6;
  uint uVar7;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  
  if ((rowgroup->tag->model & 1) == 0) {
    pLVar2 = doc->lexer;
    node = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node != (Node *)0x0) {
      do {
        pDVar5 = node->tag;
        if (pDVar5 == rowgroup->tag) {
          if (node->type == EndTag) {
            rowgroup->closed = yes;
            prvTidyFreeNode(doc,node);
            return;
          }
          goto LAB_00142055;
        }
        if (((pDVar5 != (Dict *)0x0) && (pDVar5->id == TidyTag_TABLE)) && (node->type == EndTag))
        goto LAB_00142055;
        BVar3 = InsertMisc(rowgroup,node);
        if (BVar3 == no) {
          if (node->tag == (Dict *)0x0) {
            if (node->type != TextNode) goto LAB_00141fb3;
LAB_00141e9c:
            BVar3 = prvTidynodeIsText(node);
            pNVar4 = extraout_RDX;
            if ((BVar3 == no) &&
               (BVar3 = prvTidynodeHasCM(node,0x18), pNVar4 = extraout_RDX_00, BVar3 == no)) {
              if ((node->tag->model & 4) == 0) goto LAB_00141e43;
              prvTidyReport(doc,rowgroup,node,0x27e);
              MoveToHead(doc,rowgroup,node);
            }
            else {
              MoveBeforeTable((TidyDocImpl *)rowgroup,node,pNVar4);
              prvTidyReport(doc,rowgroup,node,0x27e);
              pLVar2->exiled = yes;
              if (node->type != TextNode) {
                ParseTag(doc,node,IgnoreWhitespace);
              }
              pLVar2->exiled = no;
            }
          }
          else {
            if (node->type != EndTag) {
              TVar1 = node->tag->id;
              if ((TVar1 != TidyTag_TH) && (TVar1 != TidyTag_TD)) goto LAB_00141e9c;
              prvTidyUngetToken(doc);
              node = prvTidyInferredTag(doc,TidyTag_TR);
              prvTidyReport(doc,rowgroup,node,0x261);
            }
LAB_00141e43:
            pDVar5 = node->tag;
            if (node->type == EndTag) {
              if ((pDVar5 == (Dict *)0x0) || (pDVar5->id != TidyTag_FORM)) {
                BVar3 = prvTidynodeHasCM(node,0x18);
                pDVar5 = node->tag;
                if (BVar3 == no) {
                  pNVar4 = rowgroup;
                  if (((pDVar5 == (Dict *)0x0) || (uVar7 = pDVar5->id - TidyTag_TD, 6 < uVar7)) ||
                     ((0x49U >> (uVar7 & 0x1f) & 1) == 0)) {
                    while (pNVar4 = pNVar4->parent, pNVar4 != (Node *)0x0) {
                      if (pDVar5 == pNVar4->tag) goto LAB_00142055;
                    }
                    goto LAB_00141f3d;
                  }
                }
                else if ((pDVar5 != (Dict *)0x0) && (pDVar5->id == TidyTag_FORM)) goto LAB_00141e87;
              }
              else {
LAB_00141e87:
                *(byte *)&doc->badForm = (byte)doc->badForm | 1;
              }
            }
            else {
LAB_00141f3d:
              if ((pDVar5->model & 0x100) == 0) {
                if (node->type != EndTag) {
                  if (pDVar5->id != TidyTag_TR) {
                    node = prvTidyInferredTag(doc,TidyTag_TR);
                    prvTidyReport(doc,rowgroup,node,0x261);
                    prvTidyUngetToken(doc);
                  }
                  node->parent = rowgroup;
                  pNVar4 = rowgroup->last;
                  node->prev = pNVar4;
                  ppNVar6 = &pNVar4->next;
                  if (pNVar4 == (Node *)0x0) {
                    ppNVar6 = &rowgroup->content;
                  }
                  *ppNVar6 = node;
                  rowgroup->last = node;
                  ParseTag(doc,node,IgnoreWhitespace);
                  goto LAB_00141fd3;
                }
              }
              else if (node->type != EndTag) {
LAB_00142055:
                prvTidyUngetToken(doc);
                return;
              }
            }
LAB_00141fb3:
            prvTidyReport(doc,rowgroup,node,0x235);
            prvTidyFreeNode(doc,node);
          }
        }
LAB_00141fd3:
        node = prvTidyGetToken(doc,IgnoreWhitespace);
      } while (node != (Node *)0x0);
    }
  }
  return;
}

Assistant:

void TY_(ParseRowGroup)(TidyDocImpl* doc, Node *rowgroup, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node, *parent;

    if (rowgroup->tag->model & CM_EMPTY)
        return;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == rowgroup->tag)
        {
            if (node->type == EndTag)
            {
                rowgroup->closed = yes;
                TY_(FreeNode)( doc, node);
                return;
            }

            TY_(UngetToken)( doc );
            return;
        }

        /* if </table> infer end tag */
        if ( nodeIsTABLE(node) && node->type == EndTag )
        {
            TY_(UngetToken)( doc );
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(rowgroup, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL && node->type != TextNode)
        {
            TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
          if TD or TH then infer <TR>
          if text or inline or block move before table
          if head content move to head
        */

        if (node->type != EndTag)
        {
            if ( nodeIsTD(node) || nodeIsTH(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_TR);
                TY_(Report)(doc, rowgroup, node, MISSING_STARTTAG);
            }
            else if ( TY_(nodeIsText)(node)
                      || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
            {
                MoveBeforeTable( doc, rowgroup, node );
                TY_(Report)(doc, rowgroup, node, TAG_NOT_ALLOWED_IN);
                lexer->exiled = yes;

                if (node->type != TextNode)
                    ParseTag(doc, node, IgnoreWhitespace);

                lexer->exiled = no;
                continue;
            }
            else if (node->tag->model & CM_HEAD)
            {
                TY_(Report)(doc, rowgroup, node, TAG_NOT_ALLOWED_IN);
                MoveToHead(doc, rowgroup, node);
                continue;
            }
        }

        /* 
          if this is the end tag for ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
            {
                if ( nodeIsFORM(node) )
                    BadForm( doc );

                TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if ( nodeIsTR(node) || nodeIsTD(node) || nodeIsTH(node) )
            {
                TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = rowgroup->parent;
                  parent != NULL;
                  parent = parent->parent )
            {
                if (node->tag == parent->tag)
                {
                    TY_(UngetToken)( doc );
                    return;
                }
            }
        }

        /*
          if THEAD, TFOOT or TBODY then implied end tag

        */
        if (node->tag->model & CM_ROWGRP)
        {
            if (node->type != EndTag)
            {
                TY_(UngetToken)( doc );
                return;
            }
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        if ( !nodeIsTR(node) )
        {
            node = TY_(InferredTag)(doc, TidyTag_TR);
            TY_(Report)(doc, rowgroup, node, MISSING_STARTTAG);
            TY_(UngetToken)( doc );
        }

       /* node should be <TR> */
        TY_(InsertNodeAtEnd)(rowgroup, node);
        ParseTag(doc, node, IgnoreWhitespace);
    }

}